

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O2

EStatusCode __thiscall
CFFPrimitiveReader::ReadCard16(CFFPrimitiveReader *this,unsigned_short *outValue)

{
  EStatusCode EVar1;
  EStatusCode EVar2;
  Byte byte2;
  Byte byte1;
  
  EVar1 = ReadByte(this,&byte1);
  EVar2 = eFailure;
  if (EVar1 == eSuccess) {
    EVar1 = ReadByte(this,&byte2);
    if (EVar1 == eSuccess) {
      *outValue = _byte2;
      EVar2 = eSuccess;
    }
  }
  return EVar2;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadCard16(unsigned short& outValue)
{
	Byte byte1,byte2;

	if(ReadByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;


	outValue = ((unsigned short)byte1 << 8) + byte2;

	return PDFHummus::eSuccess;

}